

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::HandleHashCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  ostream *poVar2;
  bool bVar3;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> hash;
  ostringstream e;
  string local_1b8;
  string local_198 [11];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    cmCryptoHash::New((cmCryptoHash *)&local_1b8,(pbVar1->_M_dataplus)._M_p);
    bVar3 = (cmCryptoHash *)local_1b8._M_dataplus._M_p != (cmCryptoHash *)0x0;
    if (bVar3) {
      cmCryptoHash::HashString
                (local_198,(cmCryptoHash *)local_1b8._M_dataplus._M_p,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 2);
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1,local_198[0]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)local_198);
    }
    std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
              ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)&local_1b8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    poVar2 = std::operator<<((ostream *)local_198,
                             (string *)
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
    std::operator<<(poVar2," requires an output variable and an input string");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmStringCommand::HandleHashCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  if (args.size() != 3) {
    std::ostringstream e;
    e << args[0] << " requires an output variable and an input string";
    this->SetError(e.str());
    return false;
  }

  std::unique_ptr<cmCryptoHash> hash(cmCryptoHash::New(args[0].c_str()));
  if (hash) {
    std::string out = hash->HashString(args[2]);
    this->Makefile->AddDefinition(args[1], out.c_str());
    return true;
  }
  return false;
#else
  std::ostringstream e;
  e << args[0] << " not available during bootstrap";
  this->SetError(e.str().c_str());
  return false;
#endif
}